

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

uint32_t __thiscall
ddd::DaTrie<true,_false,_false>::excheck_
          (DaTrie<true,_false,_false> *this,Edge *edge,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint32_t uVar1;
  pointer pBVar2;
  uint32_t block_pos;
  long lVar3;
  
  uVar1 = this->head_pos_;
  if (uVar1 != 0xffffffff) {
    pBVar2 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2;
    block_pos = uVar1;
    do {
      if ((lVar3 >> 4) - 1U != (ulong)block_pos) {
        uVar1 = excheck_in_block_(this,edge,block_pos,blocks);
        if (uVar1 != 0xffffffff) {
          this->head_pos_ = block_pos;
          return uVar1;
        }
        pBVar2 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar1 = this->head_pos_;
      }
      block_pos = pBVar2[block_pos].next;
    } while (block_pos != uVar1);
  }
  return 0xffffffff;
}

Assistant:

uint32_t excheck_(const Edge& edge, const std::vector<BlockLink>& blocks) {
    assert(0 < edge.size());

    if (head_pos_ == NOT_FOUND) {
      return NOT_FOUND;
    }

    auto block_pos = head_pos_;
    auto last_block = blocks.size() - 1;

    do {
      if (last_block == block_pos) {
        continue;
      }
      auto base = excheck_in_block_(edge, block_pos, blocks);
      if (base != NOT_FOUND) {
        head_pos_ = block_pos; // update for remaining
        return base;
      }
    } while ((block_pos = blocks[block_pos].next) != head_pos_);

    return NOT_FOUND;
  }